

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_binary_arith_slow(JSContext *ctx,JSValue *sp,OPCodeEnum op)

{
  JSValue v_00;
  JSValue val_00;
  int iVar1;
  JSValueUnion *pJVar2;
  undefined4 in_EDX;
  long in_RSI;
  JSContext *in_RDI;
  JSValue JVar3;
  double r;
  double d2;
  double d1;
  JSValue op2;
  JSValue op1;
  anon_union_8_2_94730072 t;
  anon_union_8_2_94730072 u;
  int32_t val;
  JSValue v;
  double in_stack_ffffffffffffff08;
  JSContext *in_stack_ffffffffffffff10;
  JSContext *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  int64_t in_stack_ffffffffffffff28;
  uint uStack_cc;
  double local_b0;
  double local_a8;
  double local_a0;
  JSValueUnion local_58;
  double local_50;
  undefined4 uStack_44;
  JSValueUnion local_10;
  double local_8;
  
  JVar3.u._4_4_ = in_stack_ffffffffffffff24;
  JVar3.u.int32 = in_stack_ffffffffffffff20;
  JVar3.tag = in_stack_ffffffffffffff28;
  iVar1 = JS_ToFloat64Free(in_stack_ffffffffffffff18,(double *)in_stack_ffffffffffffff10,JVar3);
  if (iVar1 == 0) {
    val_00.u._4_4_ = in_stack_ffffffffffffff24;
    val_00.u.int32 = in_stack_ffffffffffffff20;
    val_00.tag = in_stack_ffffffffffffff28;
    iVar1 = JS_ToFloat64Free(in_stack_ffffffffffffff18,(double *)in_stack_ffffffffffffff10,val_00);
    if (iVar1 == 0) {
      switch(in_EDX) {
      case 0x9a:
        local_b0 = local_a0 * local_a8;
        break;
      case 0x9b:
        local_b0 = local_a0 / local_a8;
        break;
      case 0x9c:
        local_b0 = fmod(local_a0,local_a8);
        break;
      default:
        abort();
      case 0x9e:
        local_b0 = local_a0 - local_a8;
        break;
      case 0x9f:
        local_b0 = js_pow(in_stack_ffffffffffffff08,7.16711388483146e-318);
      }
      pJVar2 = (JSValueUnion *)(in_RSI + -0x20);
      if (local_b0 == (double)(int)local_b0) {
        local_10._4_4_ = uStack_44;
        local_10.int32 = (int)local_b0;
        local_8 = 0.0;
      }
      else {
        JVar3 = __JS_NewFloat64(in_RDI,local_b0);
        local_58 = JVar3.u;
        local_10 = local_58;
        local_50 = (double)JVar3.tag;
        local_8 = local_50;
      }
      *pJVar2 = local_10;
      pJVar2[1].float64 = local_8;
      return 0;
    }
  }
  else {
    v_00.tag._0_4_ = in_stack_ffffffffffffff20;
    v_00.u.ptr = in_stack_ffffffffffffff18;
    v_00.tag._4_4_ = in_stack_ffffffffffffff24;
    JS_FreeValue(in_stack_ffffffffffffff10,v_00);
  }
  *(ulong *)(in_RSI + -0x20) = (ulong)uStack_cc << 0x20;
  *(undefined8 *)(in_RSI + -0x18) = 3;
  *(ulong *)(in_RSI + -0x10) = (ulong)in_stack_ffffffffffffff24 << 0x20;
  *(undefined8 *)(in_RSI + -8) = 3;
  return -1;
}

Assistant:

int js_binary_arith_slow(JSContext *ctx, JSValue *sp,
                                                      OPCodeEnum op)
{
    JSValue op1, op2;
    double d1, d2, r;

    op1 = sp[-2];
    op2 = sp[-1];
    if (unlikely(JS_ToFloat64Free(ctx, &d1, op1))) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    if (unlikely(JS_ToFloat64Free(ctx, &d2, op2))) {
        goto exception;
    }
    switch(op) {
    case OP_sub:
        r = d1 - d2;
        break;
    case OP_mul:
        r = d1 * d2;
        break;
    case OP_div:
        r = d1 / d2;
        break;
    case OP_mod:
        r = fmod(d1, d2);
        break;
    case OP_pow:
        r = js_pow(d1, d2);
        break;
    default:
        abort();
    }
    sp[-2] = JS_NewFloat64(ctx, r);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}